

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

int HighFreqSub::pipeController(zloop_t *loop,zsock_t *reader,void *arg)

{
  _Bool _Var1;
  zframe_t *self;
  zsock_t *pzVar2;
  char *string;
  zframe_t *f;
  zframe_t *local_d8;
  string local_d0;
  HighFreqDataType local_b0;
  
  self = zframe_recv(reader);
  local_d8 = self;
  _Var1 = zframe_streq(self,"$TERM");
  if (_Var1) {
    return -1;
  }
  _Var1 = zframe_streq(self,"$DRG");
  if (_Var1) {
    zloop_reader_end(loop,*(zsock_t **)((long)arg + 0xa8));
    zsock_destroy_checked
              ((zsock_t **)((long)arg + 0xa8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0x7c);
    string = "$DRGD";
  }
  else {
    _Var1 = zframe_streq(self,"$REG");
    if (!_Var1) {
      (**(code **)(*arg + 0x18))(arg,loop,reader,self);
      goto LAB_001721f6;
    }
    if (*(long *)((long)arg + 0xa8) == 0) {
      HighFreqDataType::HighFreqDataType(&local_b0,(HighFreqDataType *)((long)arg + 8));
      HighFreqDataType::getSockAddr_abi_cxx11_(&local_d0,&local_b0);
      pzVar2 = zsock_new_sub_checked
                         (local_d0._M_dataplus._M_p,"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                          ,0x81);
      *(zsock_t **)((long)arg + 0xa8) = pzVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      HighFreqDataType::~HighFreqDataType(&local_b0);
    }
    (**(code **)(*arg + 0x20))(arg,loop);
    string = "$REGD";
  }
  zstr_send(reader,string);
LAB_001721f6:
  zframe_destroy(&local_d8);
  return 0;
}

Assistant:

int HighFreqSub::pipeController(zloop_t *loop, zsock_t *reader, void *arg){
    zframe_t *f = zframe_recv(reader);
    HighFreqSub *self = (HighFreqSub*)arg;
    if(zframe_streq(f, "$TERM")){
        return -1;
    }
    else if(zframe_streq(f, deregdt)){
        zloop_reader_end(loop, self->sub);
        zsock_destroy(&self->sub);
        zstr_send(reader, deregdone);
    }
    else if(zframe_streq(f, regdt)){
        if(!self->sub)
            self->sub = zsock_new_sub(self->getType().getSockAddr().c_str(), "");
        self->sub_reader(loop);
        zstr_send(reader, regdone);
    }
    else{
        self->customCommands(loop, reader, f);
    }
    zframe_destroy(&f);
    return 0;
}